

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_SimpleArray<bool> *a)

{
  bool local_35;
  int local_34;
  bool *pbStack_30;
  int i;
  bool *b;
  char *c;
  bool rc;
  ON_SimpleArray<bool> *pOStack_18;
  int count;
  ON_SimpleArray<bool> *a_local;
  ON_BinaryArchive *this_local;
  
  pOStack_18 = a;
  a_local = (ON_SimpleArray<bool> *)this;
  ON_SimpleArray<bool>::Empty(a);
  c._4_4_ = 0;
  c._3_1_ = ReadInt(this,(ON__INT32 *)((long)&c + 4));
  if (((bool)c._3_1_) && (0 < c._4_4_)) {
    ON_SimpleArray<bool>::SetCapacity(pOStack_18,(long)c._4_4_);
    b = (bool *)0x0;
    pbStack_30 = ON_SimpleArray<bool>::Array(pOStack_18);
    b = pbStack_30;
    c._3_1_ = ReadChar(this,(long)c._4_4_,pbStack_30);
    if ((bool)c._3_1_) {
      if (b == pbStack_30) {
        ON_SimpleArray<bool>::SetCount(pOStack_18,c._4_4_);
      }
      else if (b != (bool *)0x0) {
        for (local_34 = 0; local_34 < c._4_4_; local_34 = local_34 + 1) {
          local_35 = (bool)(-(b[local_34] != false) & 1);
          ON_SimpleArray<bool>::Append(pOStack_18,&local_35);
        }
        onfree(b);
      }
    }
  }
  return (bool)(c._3_1_ & 1);
}

Assistant:

bool 
ON_BinaryArchive::ReadArray( ON_SimpleArray<bool>& a )
{
#if defined(ON_COMPILER_MSC)
// Disable the MSC /W4 "conditional expression is constant" warning
// about sizeof(*c) == sizeof(*b).  Since this code has to run on machines
// where sizeof(bool) can be 1, 2, 4, or 8 bytes, the test is necessary.
#pragma ON_PRAGMA_WARNING_PUSH
#pragma ON_PRAGMA_WARNING_DISABLE_MSC( 4127 )
#endif

  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    char* c = 0;
    bool* b = a.Array();
    if ( sizeof(*c) == sizeof(*b) )
    {
      // 8 bit "bool" on this compiler
      c = (char*)b;
    }
    else if ( b )
    {
      // bigger "bool" on this compiler
      c = (char*)onmalloc(count*sizeof(*c));
    }
    rc = ReadChar( count, c );
    if ( rc )
    {
      if ( c == (char*)b )
      {
        a.SetCount(count);
      }
      else if ( c )
      {
        int i;
        for ( i = 0; i < count; i++ )
        {
          a.Append(c[i]?true:false);
        }
        onfree(c);
      }
    }
  }
  return rc;

#if defined(ON_COMPILER_MSC)
#pragma ON_PRAGMA_WARNING_POP
#endif

}